

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O2

void spvtools::val::UpdateContinueConstructExitBlocks
               (Function *function,
               vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *back_edges)

{
  uint32_t block_id;
  uint32_t uVar1;
  pointer ppVar2;
  Construct *this;
  ConstructType CVar3;
  _List_node_base *p_Var4;
  pointer ppVar5;
  BasicBlock *pBVar6;
  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> *pvVar7;
  _List_node_base *p_Var8;
  pair<spvtools::val::BasicBlock_*,_bool> pVar9;
  Construct construct;
  Construct local_60;
  
  p_Var4 = (_List_node_base *)Function::constructs_abi_cxx11_(function);
  ppVar5 = (back_edges->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (back_edges->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar5 == ppVar2) {
      return;
    }
    block_id = ppVar5->first;
    uVar1 = ppVar5->second;
    p_Var8 = p_Var4;
    while (p_Var8 = (((_List_base<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_>
                       *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var8 != p_Var4) {
      Construct::Construct(&local_60,(Construct *)(p_Var8 + 1));
      CVar3 = Construct::type(&local_60);
      if (CVar3 == kLoop) {
        pBVar6 = Construct::entry_block(&local_60);
        if (pBVar6->id_ == uVar1) {
          pvVar7 = Construct::corresponding_constructs(&local_60);
          this = (pvVar7->
                 super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish[-1];
          CVar3 = Construct::type(this);
          if (CVar3 != kContinue) {
            __assert_fail("continue_construct->type() == ConstructType::kContinue",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp"
                          ,0x198,
                          "void spvtools::val::UpdateContinueConstructExitBlocks(Function &, const std::vector<std::pair<uint32_t, uint32_t>> &)"
                         );
          }
          pVar9 = Function::GetBlock(function,block_id);
          Construct::set_exit(this,pVar9.first);
        }
      }
      std::_Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::
      ~_Vector_base(&local_60.corresponding_constructs_.
                     super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                   );
    }
    ppVar5 = ppVar5 + 1;
  } while( true );
}

Assistant:

void UpdateContinueConstructExitBlocks(
    Function& function,
    const std::vector<std::pair<uint32_t, uint32_t>>& back_edges) {
  auto& constructs = function.constructs();
  // TODO(umar): Think of a faster way to do this
  for (auto& edge : back_edges) {
    uint32_t back_edge_block_id;
    uint32_t loop_header_block_id;
    std::tie(back_edge_block_id, loop_header_block_id) = edge;
    auto is_this_header = [=](Construct& c) {
      return c.type() == ConstructType::kLoop &&
             c.entry_block()->id() == loop_header_block_id;
    };

    for (auto construct : constructs) {
      if (is_this_header(construct)) {
        Construct* continue_construct =
            construct.corresponding_constructs().back();
        assert(continue_construct->type() == ConstructType::kContinue);

        BasicBlock* back_edge_block;
        std::tie(back_edge_block, std::ignore) =
            function.GetBlock(back_edge_block_id);
        continue_construct->set_exit(back_edge_block);
      }
    }
  }
}